

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objnam.c
# Opt level: O0

char * Tobjnam(obj *otmp,char *verb)

{
  char *pcVar1;
  char *__src;
  char *bp;
  char *verb_local;
  obj *otmp_local;
  
  pcVar1 = xname(otmp);
  pcVar1 = The(pcVar1);
  if (verb != (char *)0x0) {
    strcat(pcVar1," ");
    __src = otense(otmp,verb);
    strcat(pcVar1,__src);
  }
  return pcVar1;
}

Assistant:

char *Tobjnam(const struct obj *otmp, const char *verb)
{
	char *bp = The(xname(otmp));

	if (verb) {
	    strcat(bp, " ");
	    strcat(bp, otense(otmp, verb));
	}
	return bp;
}